

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O3

xmlParserInputPtr testExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  stat buf;
  stat64 local_b0;
  
  iVar1 = stat64(URL,&local_b0);
  if ((iVar1 != -1) && ((local_b0.st_mode & 0xf000) == 0x8000)) {
    pxVar3 = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(URL,ID,ctxt);
    return pxVar3;
  }
  iVar1 = xmlMemUsed();
  pxVar3 = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(URL,ID,ctxt);
  iVar2 = xmlMemUsed();
  extraMemoryFromResolver = extraMemoryFromResolver + (iVar2 - iVar1);
  return pxVar3;
}

Assistant:

static xmlParserInputPtr
testExternalEntityLoader(const char *URL, const char *ID,
			 xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr ret;

    if (checkTestFile(URL)) {
	ret = xmlNoNetExternalEntityLoader(URL, ID, ctxt);
    } else {
	int memused = xmlMemUsed();
	ret = xmlNoNetExternalEntityLoader(URL, ID, ctxt);
	extraMemoryFromResolver += xmlMemUsed() - memused;
    }

    return(ret);
}